

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

bool tinyusdz::io::ReadWholeFile
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,
               string *filepath,size_t filesize_max,void *userdata)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  reference pvVar4;
  string local_4e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0 [32];
  __cxx11 local_4a0 [32];
  __cxx11 local_480 [32];
  string local_460 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [32];
  string local_3a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380 [32];
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  string local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [32];
  undefined1 local_2e0 [16];
  ulong local_2d0;
  size_t sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [32];
  undefined4 local_288;
  undefined4 local_284;
  int buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  long local_240;
  ifstream f;
  void *userdata_local;
  size_t filesize_max_local;
  string *filepath_local;
  string *err_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  pcVar1 = (char *)::std::__cxx11::string::c_str();
  ::std::ifstream::ifstream(&local_240,pcVar1,_S_bin);
  uVar2 = ::std::ios::operator!((ios *)((long)&local_240 + *(long *)(local_240 + -0x18)));
  if ((uVar2 & 1) == 0) {
    local_288 = ::std::istream::peek();
    uVar2 = ::std::ios::operator!((ios *)((long)&local_240 + *(long *)(local_240 + -0x18)));
    if ((uVar2 & 1) == 0) {
      ::std::istream::seekg((long)&local_240,_S_beg);
      local_2e0 = ::std::istream::tellg();
      local_2d0 = ::std::fpos::operator_cast_to_long((fpos *)local_2e0);
      ::std::istream::seekg((long)&local_240,_S_beg);
      uVar2 = local_2d0;
      if ((long)local_2d0 < 0) {
        if (err != (string *)0x0) {
          ::std::operator+((char *)local_320,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Invalid file size : ");
          ::std::operator+(local_300,(char *)local_320);
          ::std::__cxx11::string::operator+=((string *)err,(string *)local_300);
          ::std::__cxx11::string::~string((string *)local_300);
          ::std::__cxx11::string::~string(local_320);
        }
        out_local._7_1_ = false;
      }
      else if (local_2d0 == 0) {
        if (err != (string *)0x0) {
          ::std::operator+((char *)local_360,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "File is empty : ");
          ::std::operator+(local_340,(char *)local_360);
          ::std::__cxx11::string::operator+=((string *)err,(string *)local_340);
          ::std::__cxx11::string::~string((string *)local_340);
          ::std::__cxx11::string::~string(local_360);
        }
        out_local._7_1_ = false;
      }
      else {
        uVar3 = ::std::numeric_limits<long>::max();
        if (uVar2 < uVar3) {
          if ((filesize_max == 0) || (local_2d0 <= filesize_max)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)out,local_2d0);
            pvVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(out,0);
            ::std::istream::read((char *)&local_240,(long)pvVar4);
            uVar2 = ::std::ios::operator!((ios *)((long)&local_240 + *(long *)(local_240 + -0x18)));
            if ((uVar2 & 1) == 0) {
              out_local._7_1_ = true;
            }
            else {
              if (err != (string *)0x0) {
                ::std::operator+((char *)local_4e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Failed to read file: ");
                ::std::operator+(local_4c0,(char *)local_4e0);
                ::std::__cxx11::string::operator+=((string *)err,(string *)local_4c0);
                ::std::__cxx11::string::~string((string *)local_4c0);
                ::std::__cxx11::string::~string(local_4e0);
              }
              out_local._7_1_ = false;
            }
          }
          else {
            if (err != (string *)0x0) {
              ::std::operator+((char *)local_460,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "File size is too large : ");
              ::std::operator+(local_440,(char *)local_460);
              std::__cxx11::to_string(local_480,local_2d0);
              ::std::operator+(local_420,local_440);
              ::std::operator+(local_400,(char *)local_420);
              std::__cxx11::to_string(local_4a0,filesize_max);
              ::std::operator+(local_3e0,local_400);
              ::std::operator+(local_3c0,(char *)local_3e0);
              ::std::__cxx11::string::operator+=((string *)err,(string *)local_3c0);
              ::std::__cxx11::string::~string((string *)local_3c0);
              ::std::__cxx11::string::~string((string *)local_3e0);
              ::std::__cxx11::string::~string((string *)local_4a0);
              ::std::__cxx11::string::~string((string *)local_400);
              ::std::__cxx11::string::~string((string *)local_420);
              ::std::__cxx11::string::~string((string *)local_480);
              ::std::__cxx11::string::~string((string *)local_440);
              ::std::__cxx11::string::~string(local_460);
            }
            out_local._7_1_ = false;
          }
        }
        else {
          if (err != (string *)0x0) {
            ::std::operator+((char *)local_3a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Invalid File(Pipe or special device?) : ");
            ::std::operator+(local_380,(char *)local_3a0);
            ::std::__cxx11::string::operator+=((string *)err,(string *)local_380);
            ::std::__cxx11::string::~string((string *)local_380);
            ::std::__cxx11::string::~string(local_3a0);
          }
          out_local._7_1_ = false;
        }
      }
    }
    else {
      if (err != (string *)0x0) {
        ::std::operator+((char *)&sz,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "File read error. Maybe empty file or invalid file : ");
        ::std::operator+(local_2a8,(char *)&sz);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_2a8);
        ::std::__cxx11::string::~string((string *)local_2a8);
        ::std::__cxx11::string::~string((string *)&sz);
      }
      out_local._7_1_ = false;
    }
  }
  else {
    if (err != (string *)0x0) {
      ::std::operator+((char *)&buf,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "File open error : ");
      ::std::operator+(local_260,(char *)&buf);
      ::std::__cxx11::string::operator+=((string *)err,(string *)local_260);
      ::std::__cxx11::string::~string((string *)local_260);
      ::std::__cxx11::string::~string((string *)&buf);
    }
    out_local._7_1_ = false;
  }
  local_284 = 1;
  ::std::ifstream::~ifstream(&local_240);
  return out_local._7_1_;
}

Assistant:

bool ReadWholeFile(std::vector<uint8_t> *out, std::string *err,
                   const std::string &filepath, size_t filesize_max,
                   void *userdata) {
  (void)userdata;

#ifdef TINYUSDZ_ANDROID_LOAD_FROM_ASSETS
  if (tinyusdz::io::asset_manager) {
    AAsset *asset = AAssetManager_open(asset_manager, filepath.c_str(),
                                       AASSET_MODE_STREAMING);
    if (!asset) {
      if (err) {
        (*err) += "File open error(from AssestManager) : " + filepath + "\n";
      }
      return false;
    }
    off_t len = AAsset_getLength(asset);
    if (len <= 0) {
      if (err) {
        (*err) += "Invalid file size : " + filepath +
                  " (does the path point to a directory?)";
      }
      return false;
    }
    size_t size = size_t(len);

    if (size >= filesize_max) {
      (*err) += "File size exceeds filesize_max : " + filepath +
                " (filesize_max " + std::to_string(filesize_max) + ")";

      return false;
    }

    out->resize(size);
    AAsset_read(asset, reinterpret_cast<char *>(&out->at(0)), size);
    AAsset_close(asset);
    return true;
  } else {
    if (err) {
      (*err) += "No asset manager specified : " + filepath + "\n";
    }
    return false;
  }

#else
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor =
      _wopen(UTF8ToWchar(filepath).c_str(), _O_RDONLY | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(file_descriptor, std::ios_base::in);
  std::istream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  // For libcxx, assume _LIBCPP_HAS_OPEN_WITH_WCHAR is defined to accept
  // `wchar_t *`
  std::ifstream f(UTF8ToWchar(filepath).c_str(), std::ifstream::binary);
#else
  // Unknown compiler/runtime
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
#else
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File open error : " + filepath + "\n";
    }
    return false;
  }

  // For directory(and pipe?), peek() will fail(Posix gnustl/libc++ only)
  int buf = f.peek();
  (void)buf;
  if (!f) {
    if (err) {
      (*err) +=
          "File read error. Maybe empty file or invalid file : " + filepath +
          "\n";
    }
    return false;
  }

  f.seekg(0, f.end);
  size_t sz = static_cast<size_t>(f.tellg());
  f.seekg(0, f.beg);

  if (int64_t(sz) < 0) {
    if (err) {
      (*err) += "Invalid file size : " + filepath +
                " (does the path point to a directory?)";
    }
    return false;
  } else if (sz == 0) {
    if (err) {
      (*err) += "File is empty : " + filepath + "\n";
    }
    return false;
  } else if (uint64_t(sz) >= uint64_t(std::numeric_limits<int64_t>::max())) {
    // Posixish environment.
    if (err) {
      (*err) += "Invalid File(Pipe or special device?) : " + filepath + "\n";
    }
    return false;
  }

  if ((filesize_max > 0) && (sz > filesize_max)) {
    if (err) {
      (*err) += "File size is too large : " + filepath +
                " sz = " + std::to_string(sz) +
                ", allowed max filesize = " + std::to_string(filesize_max) +
                "\n";
    }
    return false;
  }

  out->resize(sz);
  f.read(reinterpret_cast<char *>(&out->at(0)),
         static_cast<std::streamsize>(sz));

  if (!f) {
    // read failure.
    if (err) {
      (*err) += "Failed to read file: " + filepath + "\n";
    }
    return false;
  }

  return true;
#endif
}